

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O1

Vec_Ptr_t *
Abc_GiaDeriveSops(Abc_Ntk_t *pNtkNew,Gia_Man_t *p,Vec_Wec_t *vSupps,int nCubeLim,int nBTLimit,
                 int nCostMax,int fCanon,int fReverse,int fCnfShared,int fVerbose)

{
  uint nItemsTotal;
  void *__ptr;
  int iVar1;
  int iVar2;
  Vec_Wec_t *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int *__ptr_01;
  void *__s;
  ProgressBar *p_01;
  Vec_Int_t *vSupp;
  Vec_Str_t *__ptr_02;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  void **__s_00;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Cnf_Dat_t *local_68;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&ts);
  if (iVar1 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  __ptr_00 = Gia_ManIsoStrashReduceInt(p,vSupps,0);
  if (fVerbose != 0) {
    printf("Considering %d (out of %d) outputs. ",(ulong)(uint)__ptr_00->nSize,
           (ulong)(uint)p->vCos->nSize);
    iVar2 = 3;
    iVar1 = clock_gettime(3,(timespec *)&ts);
    if (iVar1 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar2,"%s =","Reduction time");
    Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar10 + lVar8) / 1000000.0);
  }
  iVar1 = __ptr_00->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar3;
  if (0 < iVar1) {
    lVar8 = 8;
    lVar10 = 0;
    do {
      if (0 < *(int *)((long)__ptr_00->pArray + lVar8 + -4)) {
        Vec_IntPush(p_00,**(int **)((long)&__ptr_00->pArray->nCap + lVar8));
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar10 < __ptr_00->nSize);
  }
  nItemsTotal = p_00->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  uVar9 = 0x10;
  if (0xe < nItemsTotal - 1) {
    uVar9 = nItemsTotal;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar9;
  if (uVar9 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)(int)uVar9 << 2);
  }
  pVVar4->pArray = piVar3;
  if (0 < (int)nItemsTotal) {
    piVar3 = p_00->pArray;
    uVar11 = 0;
    do {
      iVar1 = piVar3[uVar11];
      if (((long)iVar1 < 0) || (vSupps->nSize <= iVar1)) goto LAB_002a2a46;
      Vec_IntPush(pVVar4,vSupps->pArray[iVar1].nSize);
      uVar11 = uVar11 + 1;
    } while (nItemsTotal != uVar11);
  }
  piVar3 = pVVar4->pArray;
  __ptr_01 = Abc_MergeSortCost(piVar3,pVVar4->nSize);
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  if (fCnfShared == 0) {
    local_68 = (Cnf_Dat_t *)0x0;
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    iVar1 = p->nObjs;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar2 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar2 = iVar1;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar2;
    if (iVar2 == 0) {
      piVar3 = (int *)0x0;
    }
    else {
      piVar3 = (int *)malloc((long)iVar2 << 2);
    }
    pVVar4->pArray = piVar3;
    pVVar4->nSize = iVar1;
    if (piVar3 != (int *)0x0) {
      memset(piVar3,0xff,(long)iVar1 << 2);
    }
    local_68 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,1,0,0,0);
  }
  uVar9 = 8;
  if (6 < nItemsTotal - 1) {
    uVar9 = nItemsTotal;
  }
  if (uVar9 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar9 << 3);
  }
  memset(__s,0,(long)(int)nItemsTotal * 8);
  p_01 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext < 1)) {
    Extra_ProgressBarUpdate_int(p_01,0,(char *)0x0);
  }
  if (0 < (int)nItemsTotal) {
    lVar8 = 0;
    uVar9 = nItemsTotal;
    do {
      uVar9 = uVar9 - 1;
      uVar7 = __ptr_01[(int)uVar9];
      uVar11 = (ulong)uVar7;
      if (nItemsTotal <= uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p_00->pArray[uVar11];
      lVar10 = (long)iVar1;
      if ((lVar10 < 0) || (vSupps->nSize <= iVar1)) goto LAB_002a2a46;
      if (vSupps->pArray[lVar10].nSize < 2) {
        *(undefined8 *)((long)__s + uVar11 * 8) = 1;
        iVar1 = 7;
      }
      else {
        vSupp = vSupps->pArray + lVar10;
        if (fCanon == 0 && fCnfShared != 0) {
          if (__ptr_00->nSize <= (int)uVar7) goto LAB_002a2a46;
          iVar2 = 0;
          if (lVar8 == 0) {
            iVar2 = fVerbose;
          }
          __ptr_02 = Abc_NtkClpGiaOne2(local_68,p,iVar1,nCubeLim,nBTLimit,0,fReverse,vSupp,pVVar4,
                                       iVar2,__ptr_00->pArray + uVar11,vSupps);
        }
        else {
          if (__ptr_00->nSize <= (int)uVar7) goto LAB_002a2a46;
          iVar2 = 0;
          if (lVar8 == 0) {
            iVar2 = fVerbose;
          }
          __ptr_02 = Abc_NtkClpGiaOne(p,iVar1,nCubeLim,nBTLimit,fCanon,fReverse,vSupp,iVar2,
                                      __ptr_00->pArray + uVar11,vSupps);
        }
        if (__ptr_02 == (Vec_Str_t *)0x0) {
          iVar1 = 8;
        }
        else {
          if (vSupps->nSize <= iVar1) {
LAB_002a2a46:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          iVar1 = vSupps->pArray[lVar10].nSize;
          iVar2 = Abc_SopGetVarNum(__ptr_02->pArray);
          if (iVar1 != iVar2) {
            __assert_fail("Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                          ,0x344,
                          "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                         );
          }
          if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar8)) {
            Extra_ProgressBarUpdate_int(p_01,(int)lVar8,(char *)0x0);
          }
          pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,__ptr_02->pArray);
          *(char **)((long)__s + uVar11 * 8) = pcVar5;
          if (__ptr_02->pArray != (char *)0x0) {
            free(__ptr_02->pArray);
            __ptr_02->pArray = (char *)0x0;
          }
          free(__ptr_02);
          iVar1 = 0;
        }
      }
      if ((iVar1 != 0) && (iVar1 != 7)) {
        if (iVar1 != 8) {
          return (Vec_Ptr_t *)(ulong)uVar9;
        }
        pVVar6 = (Vec_Ptr_t *)0x0;
        goto LAB_002a2974;
      }
      lVar8 = lVar8 + 1;
    } while ((int)nItemsTotal != lVar8);
  }
  Extra_ProgressBarStop(p_01);
  if (fCnfShared != 0) {
    Cnf_DataFree(local_68);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    if (pVVar4 != (Vec_Int_t *)0x0) {
      free(pVVar4);
    }
  }
  uVar9 = p->vCos->nSize;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar9 - 1) {
    uVar7 = uVar9;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar7;
  if (uVar7 == 0) {
    __s_00 = (void **)0x0;
  }
  else {
    __s_00 = (void **)malloc((long)(int)uVar7 << 3);
  }
  pVVar6->pArray = __s_00;
  pVVar6->nSize = uVar9;
  memset(__s_00,0,(long)(int)uVar9 << 3);
  iVar1 = __ptr_00->nSize;
  if (0 < (long)iVar1) {
    lVar8 = 0;
    do {
      pVVar4 = __ptr_00->pArray;
      uVar7 = pVVar4[lVar8].nSize;
      if (0 < (int)uVar7) {
        if ((int)nItemsTotal <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar11 = 0;
        do {
          iVar2 = pVVar4[lVar8].pArray[uVar11];
          if (((long)iVar2 < 0) || ((int)uVar9 <= iVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          __s_00[iVar2] = *(void **)((long)__s + lVar8 * 8);
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  if (0 < (int)uVar9) {
    uVar11 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(__s_00[uVar11] == (void *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
    if (iVar1 != 0) {
      __assert_fail("Vec_PtrCountZero(vSops) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x354,
                    "Vec_Ptr_t *Abc_GiaDeriveSops(Abc_Ntk_t *, Gia_Man_t *, Vec_Wec_t *, int, int, int, int, int, int, int)"
                   );
    }
  }
LAB_002a2974:
  if (__ptr_01 != (int *)0x0) {
    free(__ptr_01);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (0 < __ptr_00->nCap) {
    lVar8 = 8;
    lVar10 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_00->pArray->nCap + lVar8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&__ptr_00->pArray->nCap + lVar8) = 0;
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar10 < __ptr_00->nCap);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  if (__s != (void *)0x0) {
    free(__s);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Abc_GiaDeriveSops( Abc_Ntk_t * pNtkNew, Gia_Man_t * p, Vec_Wec_t * vSupps, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    ProgressBar * pProgress;
    abctime clk = Abc_Clock();
    Vec_Ptr_t * vSops = NULL, * vSopsRepr;
    Vec_Int_t * vReprs, * vClass, * vReprSuppSizes;
    int i, k, Entry, iCo, * pOrder;
    Vec_Wec_t * vClasses;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vMap = NULL;
    // derive classes of outputs
    vClasses = Gia_ManIsoStrashReduceInt( p, vSupps, 0 );
    if ( fVerbose )
    {
        printf( "Considering %d (out of %d) outputs. ", Vec_WecSize(vClasses), Gia_ManCoNum(p) );
        Abc_PrintTime( 1, "Reduction time", Abc_Clock() - clk );
    }
    // derive representatives
    vReprs = Vec_WecCollectFirsts( vClasses );
    vReprSuppSizes = Vec_IntAlloc( Vec_IntSize(vReprs) );
    Vec_IntForEachEntry( vReprs, Entry, i )
        Vec_IntPush( vReprSuppSizes, Vec_IntSize(Vec_WecEntry(vSupps, Entry)) );
    pOrder = Abc_MergeSortCost( Vec_IntArray(vReprSuppSizes), Vec_IntSize(vReprSuppSizes) );
    Vec_IntFree( vReprSuppSizes );
    // consider SOPs for representatives
    if ( fCnfShared )
    {
        vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 1, 0, 0, 0 );
    }
    vSopsRepr = Vec_PtrStart( Vec_IntSize(vReprs) );
    pProgress = Extra_ProgressBarStart( stdout, Vec_IntSize(vReprs) );
    Extra_ProgressBarUpdate( pProgress, 0, NULL );
    for ( i = 0; i < Vec_IntSize(vReprs); i++ )
    {
        int iEntry        = pOrder[Vec_IntSize(vReprs) - 1 - i];
        int iCoThis       = Vec_IntEntry( vReprs, iEntry );
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, iCoThis );
        Vec_Str_t * vSop;
        if ( Vec_IntSize(vSupp) < 2 )
        {
            Vec_PtrWriteEntry( vSopsRepr, iEntry, (void *)(ABC_PTRINT_T)1 );
            continue;
        }
        if ( fCnfShared && !fCanon )
            vSop = Abc_NtkClpGiaOne2( pCnf, p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, vMap, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        else
            vSop = Abc_NtkClpGiaOne( p, iCoThis, nCubeLim, nBTLimit, fCanon, fReverse, vSupp, i ? 0 : fVerbose, Vec_WecEntry(vClasses, iEntry), vSupps );
        if ( vSop == NULL )
            goto finish;
        assert( Vec_IntSize( Vec_WecEntry(vSupps, iCoThis) ) == Abc_SopGetVarNum(Vec_StrArray(vSop)) );
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        Vec_PtrWriteEntry( vSopsRepr, iEntry, Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_StrArray(vSop) ) );
        Vec_StrFree( vSop );
    }
    Extra_ProgressBarStop( pProgress );
    if ( fCnfShared )
    {
        Cnf_DataFree( pCnf );
        Vec_IntFree( vMap );
    }
    // derive SOPs for each output
    vSops = Vec_PtrStart( Gia_ManCoNum(p) );
    Vec_WecForEachLevel ( vClasses, vClass, i )
        Vec_IntForEachEntry( vClass, iCo, k )
            Vec_PtrWriteEntry( vSops, iCo, Vec_PtrEntry(vSopsRepr, i) );
    assert( Vec_PtrCountZero(vSops) == 0 );
/*
    // verify
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
    {
        Vec_Int_t * vSupp = Vec_WecEntry( vSupps, i );
        char * pSop = (char *)Vec_PtrEntry( vSops, i );
        assert( Vec_IntSize(vSupp) == Abc_SopGetVarNum(pSop) );
    }
*/
    // cleanup
finish:
    ABC_FREE( pOrder );
    Vec_IntFree( vReprs );
    Vec_WecFree( vClasses );
    Vec_PtrFree( vSopsRepr );
    return vSops;
}